

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::TypedArrayBase::GetPropertyQuery
          (TypedArrayBase *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  PropertyQueryFlags PVar6;
  BOOL BVar7;
  PropertyRecord *this_00;
  uint extraout_var;
  undefined4 *puVar8;
  PropertyString *aValue_00;
  RecyclableObject *this_01;
  double local_40;
  double result;
  Var aValue;
  
  result = (double)info;
  this_00 = ScriptContext::GetPropertyName(requestContext,propertyId);
  if (this_00->isNumeric != true) {
    if (this_00->isSymbol == false) {
      aValue_00 = ScriptContext::GetPropertyString(requestContext,propertyId);
      BVar7 = JavascriptConversion::CanonicalNumericIndexString
                        (&aValue_00->super_JavascriptString,&local_40,requestContext);
      if (BVar7 != 0) {
        *value = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        return Property_NotFound_NoProto;
      }
    }
    PVar6 = DynamicObject::GetPropertyQuery
                      ((DynamicObject *)this,originalInstance,propertyId,value,
                       (PropertyValueInfo *)result,requestContext);
    return PVar6;
  }
  uVar4 = PropertyRecord::GetNumericValue(this_00);
  iVar5 = (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x72])(this,(ulong)uVar4);
  aValue = (Var)CONCAT44(extraout_var,iVar5);
  *value = aValue;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d56fe7;
    *puVar8 = 0;
  }
  else {
    if ((extraout_var & 0x1ffff) != 0x10000 && (extraout_var & 0xffff0000) == 0x10000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar3) {
        *puVar8 = 0;
        return Property_Found;
      }
      goto LAB_00d56fe7;
    }
    if (extraout_var >> 0x12 != 0 || (extraout_var & 0xffff0000) == 0x10000) {
      return Property_Found;
    }
  }
  this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
  if (this_01 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d56fe7;
    *puVar8 = 0;
  }
  TVar1 = ((this_01->type).ptr)->typeId;
  if ((int)TVar1 < 0x58) {
    PVar6 = (PropertyQueryFlags)(TVar1 != TypeIds_Undefined);
  }
  else {
    BVar7 = RecyclableObject::IsExternal(this_01);
    PVar6 = Property_Found;
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00d56fe7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  return PVar6;
}

Assistant:

PropertyQueryFlags TypedArrayBase::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        const Js::PropertyRecord* propertyRecord = requestContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            *value = this->DirectGetItem(propertyRecord->GetNumericValue());
            if (JavascriptOperators::GetTypeId(*value) == Js::TypeIds_Undefined)
            {
                return PropertyQueryFlags::Property_NotFound;
            }
            return PropertyQueryFlags::Property_Found;
        }
        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, requestContext))
        {
            *value = requestContext->GetLibrary()->GetUndefined();
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }